

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  packet_t *pkt;
  int iVar1;
  ip_tables_t *ipts;
  char *pcVar2;
  int i;
  long lVar3;
  packet_t *pkts [2];
  packet_t *local_48 [3];
  
  if (argc == 2) {
    pcVar2 = argv[1];
  }
  else {
    pcVar2 = "../test.txt";
  }
  ipts = parse_tables(pcVar2);
  print_tables(ipts);
  local_48[0] = new_tcp_pkt("192.168.1.100","192.168.1.101",0x3039,0x50,'\x02');
  local_48[1] = new_tcp_pkt("192.168.1.101","192.168.1.100",0x3039,0x50,'\x02');
  lVar3 = 0;
  do {
    pkt = local_48[lVar3];
    pkt_set_iface(pkt,"ens33",(char *)0x0);
    if (pkt != (packet_t *)0x0) {
      pkt->state = '\x02';
    }
    print_pkt(pkt);
    iVar1 = match_tables(ipts,pkt,(ip_opt_t *)0x0);
    pcVar2 = "ACCEPT";
    if (iVar1 == 0) {
      pcVar2 = "DROP";
    }
    printf("match result\t: %s\n",pcVar2);
    free_pkt(pkt);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  free_tables(ipts);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	char *p = "../test.txt";

	if (argc == 2) {
		p = argv[1];
	}

	ip_tables_t *ipts = parse_tables(p);
	print_tables(ipts);

	packet_t *pkts[2];

	pkts[0] = new_tcp_pkt("192.168.1.100", "192.168.1.101", 12345, 80, TCP_SYN);
	pkts[1] = new_tcp_pkt("192.168.1.101", "192.168.1.100", 12345, 80, TCP_SYN);

	//pkts[0] = new_udp_pkt("192.168.1.100", "192.168.1.101", 12345, 80);
	//pkts[1] = new_udp_pkt("192.168.1.101", "192.168.1.100", 12345, 80);

	for (int i = 0; i < 2; i++) {

		pkt_set_iface(pkts[i], "ens33", NULL);
		pkt_set_state(pkts[i], STATE_NEW);
		print_pkt(pkts[i]);
		printf("match result\t: %s\n", match_tables(ipts, pkts[i], NULL) ? "ACCEPT" : "DROP");
		free_pkt(pkts[i]);
	}


	free_tables(ipts);
	return 0;
}